

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_wal_hook(sqlite3 *db,_func_int_void_ptr_sqlite3_ptr_char_ptr_int *xCallback,
                       void *pArg)

{
  void *pvVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    pvVar1 = db->pWalArg;
    db->xWalCallback = xCallback;
    db->pWalArg = pArg;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    pvVar1 = db->pWalArg;
    db->xWalCallback = xCallback;
    db->pWalArg = pArg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_wal_hook(
  sqlite3 *db,                    /* Attach the hook to this db handle */
  int(*xCallback)(void *, sqlite3*, const char*, int),
  void *pArg                      /* First argument passed to xCallback() */
){
#ifndef SQLITE_OMIT_WAL
  void *pRet;
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pWalArg;
  db->xWalCallback = xCallback;
  db->pWalArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
#else
  return 0;
#endif
}